

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

idx_t duckdb::UpdateValidityStatistics
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  bool bVar1;
  SelectionVector *in_RCX;
  undefined8 *in_RDX;
  BaseStatistics *in_RSI;
  idx_t idx;
  idx_t i;
  BaseStatistics *validity;
  ValidityMask *mask;
  sel_t *in_stack_ffffffffffffffb8;
  SelectionVector *in_stack_ffffffffffffffc0;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                    ((TemplatedValidityMask<unsigned_long> *)(in_RDX + 2));
  if ((!bVar1) && (bVar1 = BaseStatistics::CanHaveNull(in_RSI), !bVar1)) {
    for (in_stack_ffffffffffffffc0 = (SelectionVector *)0x0; in_stack_ffffffffffffffc0 < in_RCX;
        in_stack_ffffffffffffffc0 =
             (SelectionVector *)((long)&in_stack_ffffffffffffffc0->sel_vector + 1)) {
      in_stack_ffffffffffffffb8 =
           (sel_t *)SelectionVector::get_index
                              ((SelectionVector *)*in_RDX,(idx_t)in_stack_ffffffffffffffc0);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)in_RSI,
                         (idx_t)in_stack_ffffffffffffffc0);
      if (!bVar1) {
        BaseStatistics::SetHasNullFast(in_RSI);
        break;
      }
    }
  }
  SelectionVector::Initialize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return (idx_t)in_RCX;
}

Assistant:

idx_t UpdateValidityStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                               idx_t count, SelectionVector &sel) {
	auto &mask = update.validity;
	auto &validity = stats.statistics;
	if (!mask.AllValid() && !validity.CanHaveNull()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (!mask.RowIsValid(idx)) {
				validity.SetHasNullFast();
				break;
			}
		}
	}
	sel.Initialize(nullptr);
	return count;
}